

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLDocument::DeepCopy(XMLDocument *this,XMLDocument *target)

{
  XMLNode *addThis;
  XMLNode *this_00;
  
  if (target != this) {
    Clear(target);
    for (this_00 = (this->super_XMLNode)._firstChild; this_00 != (XMLNode *)0x0;
        this_00 = this_00->_next) {
      addThis = XMLNode::DeepClone(this_00,target);
      XMLNode::InsertEndChild(&target->super_XMLNode,addThis);
    }
  }
  return;
}

Assistant:

void XMLDocument::DeepCopy(XMLDocument* target) const
{
	TIXMLASSERT(target);
    if (target == this) {
        return; // technically success - a no-op.
    }

	target->Clear();
	for (const XMLNode* node = this->FirstChild(); node; node = node->NextSibling()) {
		target->InsertEndChild(node->DeepClone(target));
	}
}